

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataQueryDatumSpecification.cpp
# Opt level: O1

void __thiscall
DIS::DataQueryDatumSpecification::marshal(DataQueryDatumSpecification *this,DataStream *dataStream)

{
  pointer pUVar1;
  long lVar2;
  ulong uVar3;
  UnsignedDISInteger x;
  UnsignedDISInteger local_40;
  
  DataStream::operator<<
            (dataStream,
             (uint)((ulong)((long)(this->_fixedDatumIDList).
                                  super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->_fixedDatumIDList).
                                 super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4));
  DataStream::operator<<
            (dataStream,
             (uint)((ulong)((long)(this->_variableDatumIDList).
                                  super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->_variableDatumIDList).
                                 super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4));
  pUVar1 = (this->_fixedDatumIDList).
           super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_fixedDatumIDList).
      super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>._M_impl.
      super__Vector_impl_data._M_finish != pUVar1) {
    lVar2 = 8;
    uVar3 = 0;
    do {
      local_40._vptr_UnsignedDISInteger = (_func_int **)&PTR__UnsignedDISInteger_001b65e0;
      local_40._val = *(uint *)((long)&pUVar1->_vptr_UnsignedDISInteger + lVar2);
      UnsignedDISInteger::marshal(&local_40,dataStream);
      UnsignedDISInteger::~UnsignedDISInteger(&local_40);
      uVar3 = uVar3 + 1;
      pUVar1 = (this->_fixedDatumIDList).
               super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 < (ulong)((long)(this->_fixedDatumIDList).
                                   super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1 >> 4));
  }
  pUVar1 = (this->_variableDatumIDList).
           super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_variableDatumIDList).
      super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>._M_impl.
      super__Vector_impl_data._M_finish != pUVar1) {
    lVar2 = 8;
    uVar3 = 0;
    do {
      local_40._vptr_UnsignedDISInteger = (_func_int **)&PTR__UnsignedDISInteger_001b65e0;
      local_40._val = *(uint *)((long)&pUVar1->_vptr_UnsignedDISInteger + lVar2);
      UnsignedDISInteger::marshal(&local_40,dataStream);
      UnsignedDISInteger::~UnsignedDISInteger(&local_40);
      uVar3 = uVar3 + 1;
      pUVar1 = (this->_variableDatumIDList).
               super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 < (ulong)((long)(this->_variableDatumIDList).
                                   super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1 >> 4));
  }
  return;
}

Assistant:

void DataQueryDatumSpecification::marshal(DataStream& dataStream) const
{
    dataStream << ( unsigned int )_fixedDatumIDList.size();
    dataStream << ( unsigned int )_variableDatumIDList.size();

     for(size_t idx = 0; idx < _fixedDatumIDList.size(); idx++)
     {
        UnsignedDISInteger x = _fixedDatumIDList[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _variableDatumIDList.size(); idx++)
     {
        UnsignedDISInteger x = _variableDatumIDList[idx];
        x.marshal(dataStream);
     }

}